

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O1

void init_objects(void)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  uchar uVar4;
  short sVar5;
  short sVar6;
  objclass *poVar7;
  uint uVar8;
  int iVar9;
  short *psVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  char *pcVar21;
  int iVar22;
  
  bases[0xc] = 0;
  bases[0xd] = 0;
  bases[0xe] = 0;
  bases[0xf] = 0;
  bases[8] = 0;
  bases[9] = 0;
  bases[10] = 0;
  bases[0xb] = 0;
  bases[4] = 0;
  bases[5] = 0;
  bases[6] = 0;
  bases[7] = 0;
  bases[0] = 0;
  bases[1] = 0;
  bases[2] = 0;
  bases[3] = 0;
  bases[0x10] = 0;
  bases[0x11] = 0;
  psVar10 = &objects->oc_descr_idx;
  lVar12 = 0;
  do {
    *psVar10 = (short)lVar12;
    ((objclass *)(psVar10 + -1))->oc_name_idx = (short)lVar12;
    lVar12 = lVar12 + 1;
    psVar10 = psVar10 + 0x14;
  } while (lVar12 != 0x21a);
  iVar19 = 0;
  do {
    lVar12 = (long)iVar19;
    cVar1 = objects[lVar12].oc_class;
    iVar16 = 0x219;
    if (0x219 < iVar19) {
      iVar16 = iVar19;
    }
    iVar22 = iVar16 + 1;
    lVar15 = lVar12;
    pcVar21 = &objects[lVar12 + 1].oc_class;
    do {
      lVar13 = lVar15;
      if (0x218 < lVar13) goto LAB_00208352;
      cVar2 = *pcVar21;
      lVar15 = lVar13 + 1;
      pcVar21 = pcVar21 + 0x28;
    } while (cVar2 == cVar1);
    iVar16 = (int)lVar13;
    iVar22 = (int)(lVar13 + 1);
LAB_00208352:
    bases[(int)cVar1] = iVar19;
    if (cVar1 == '\r') {
      setgemprobs((d_level *)0x0);
      uVar8 = mt_random();
      poVar7 = objects;
      if ((uVar8 & 1) != 0) {
        objects[0x1f7].oc_descr_idx = objects[500].oc_descr_idx;
        poVar7[0x1f7].oc_color = poVar7[500].oc_color;
      }
      uVar8 = mt_random();
      poVar7 = objects;
      if ((uVar8 & 1) != 0) {
        objects[0x1f9].oc_descr_idx = objects[500].oc_descr_idx;
        poVar7[0x1f9].oc_color = poVar7[500].oc_color;
      }
      uVar8 = mt_random();
      poVar7 = objects;
      switch(uVar8 & 3) {
      case 0:
        goto switchD_002083ce_caseD_0;
      case 1:
        lVar15 = 0x4e37;
        lVar13 = 0x4e22;
        break;
      case 2:
        lVar15 = 0x4dbf;
        lVar13 = 0x4daa;
        break;
      case 3:
        lVar15 = 0x4e87;
        lVar13 = 0x4e72;
      }
      objects[0x202].oc_descr_idx = *(short *)((long)&objects->oc_name_idx + lVar13);
      poVar7[0x202].oc_color = *(uchar *)((long)&poVar7->oc_name_idx + lVar15);
    }
switchD_002083ce_caseD_0:
    poVar7 = objects + lVar12;
    while( true ) {
      iVar14 = 0;
      if (iVar19 <= iVar16) {
        iVar14 = 0;
        psVar10 = &poVar7->oc_prob;
        iVar9 = (iVar16 - iVar19) + 1;
        do {
          iVar14 = iVar14 + *psVar10;
          psVar10 = psVar10 + 0x14;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      if (iVar14 != 0) break;
      if (iVar19 <= iVar16) {
        iVar14 = 1000;
        psVar10 = &poVar7->oc_prob;
        do {
          *psVar10 = (short)(iVar14 / (iVar22 - iVar19));
          psVar10 = psVar10 + 0x14;
          iVar9 = (iVar19 - iVar16) + iVar14;
          iVar14 = iVar14 + 1;
        } while (iVar9 != 1000);
      }
    }
    if (iVar14 != 1000) {
      raw_printf("init-prob error for class %d (%d%%)\n",(ulong)(uint)(int)cVar1);
    }
    iVar19 = iVar22;
    if (0x218 < iVar16) {
      uVar18 = 1;
      do {
        uVar8 = bases[uVar18];
        lVar12 = (long)(int)uVar8;
        uVar20 = 0x219;
        if (0x219 < (int)uVar8) {
          uVar20 = (ulong)uVar8;
        }
        pcVar21 = &objects[lVar12 + 1].oc_class;
        lVar15 = 0;
        do {
          if (lVar12 - uVar20 == lVar15) goto LAB_002084f9;
          cVar1 = *pcVar21;
          lVar15 = lVar15 + -1;
          pcVar21 = pcVar21 + 0x28;
        } while (uVar18 == (uint)(int)cVar1);
        uVar20 = (ulong)(~(uint)lVar15 + uVar8);
LAB_002084f9:
        iVar19 = (int)uVar20;
        if ((((uVar18 != 0xd) && (uVar18 != 8)) && (uVar18 != 3)) &&
           ((uVar17 = (uint)uVar18, (uVar17 & 0x1b) != 2 &&
            (obj_descr[objects[lVar12].oc_descr_idx].oc_descr != (char *)0x0)))) {
          if ((uVar17 < 0xb) && ((0x620U >> (uVar17 & 0x1f) & 1) != 0)) {
            lVar12 = (long)iVar19;
            iVar19 = iVar19 + 1;
            pbVar11 = &objects[lVar12].field_0x10;
            do {
              bVar3 = *pbVar11;
              iVar19 = iVar19 + -1;
              pbVar11 = pbVar11 + -0x28;
            } while ((bVar3 & 0x50) != 0x10);
          }
          shuffle(uVar8,iVar19,'\x01');
        }
        uVar18 = uVar18 + 1;
        if (uVar18 == 0x12) {
          lVar12 = 0;
          shuffle(0x50,0x53,'\0');
          shuffle(0x8f,0x92,'\0');
          shuffle(0x84,0x87,'\0');
          shuffle(0x96,0x9c,'\0');
          uVar18 = 10;
          do {
            uVar8 = mt_random();
            poVar7 = objects;
            iVar19 = (int)((ulong)uVar8 % (uVar18 & 0xffffffff));
            uVar8 = iVar19 + 0x5f;
            sVar5 = *(short *)((long)&objects[0x68].oc_descr_idx + lVar12);
            uVar4 = (&objects[0x68].oc_color)[lVar12];
            sVar6 = *(short *)((long)&objects[0x68].oc_cost + lVar12);
            *(short *)((long)&objects[0x68].oc_descr_idx + lVar12) = objects[uVar8].oc_descr_idx;
            (&poVar7[0x68].oc_color)[lVar12] = poVar7[uVar8].oc_color;
            *(short *)((long)&poVar7[0x68].oc_cost + lVar12) = poVar7[uVar8].oc_cost;
            poVar7[uVar8].oc_descr_idx = sVar5;
            poVar7[uVar8].oc_color = uVar4;
            poVar7[uVar8].oc_cost = sVar6;
            uVar8 = iVar19 + 0x54;
            sVar5 = *(short *)((long)&poVar7[0x5d].oc_descr_idx + lVar12);
            uVar4 = (&poVar7[0x5d].oc_color)[lVar12];
            sVar6 = *(short *)((long)&poVar7[0x5d].oc_cost + lVar12);
            *(short *)((long)&poVar7[0x5d].oc_descr_idx + lVar12) = poVar7[uVar8].oc_descr_idx;
            (&poVar7[0x5d].oc_color)[lVar12] = poVar7[uVar8].oc_color;
            *(short *)((long)&poVar7[0x5d].oc_cost + lVar12) = poVar7[uVar8].oc_cost;
            poVar7[uVar8].oc_descr_idx = sVar5;
            poVar7[uVar8].oc_color = uVar4;
            poVar7[uVar8].oc_cost = sVar6;
            lVar12 = lVar12 + -0x28;
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
          shuffle(bases[8],0x131,'\x01');
          shuffle(0x12d,0x13a,'\x01');
          shuffle(0x13b,0x14e,'\x01');
          shuffle(0x12d,0x142,'\x01');
          return;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void init_objects(void)
{
	int i, first, last, sum;
	char oclass;

	/* bug fix to prevent "initialization error" abort on Intel Xenix.
	 * reported by mikew@semike
	 */
	for (i = 0; i < MAXOCLASSES; i++)
		bases[i] = 0;
	/* initialize object descriptions */
	for (i = 0; i < NUM_OBJECTS; i++)
		objects[i].oc_name_idx = objects[i].oc_descr_idx = i;
	/* init base; if probs given check that they add up to 1000,
	   otherwise compute probs */
	first = 0;
	while ( first < NUM_OBJECTS ) {
		oclass = objects[first].oc_class;
		last = first+1;
		while (last < NUM_OBJECTS && objects[last].oc_class == oclass) last++;
		bases[(int)oclass] = first;

		if (oclass == GEM_CLASS) {
			setgemprobs(NULL);

			if (rn2(2)) { /* change turquoise from green to blue? */
			    COPY_OBJ_DESCR(objects[TURQUOISE],objects[SAPPHIRE]);
			}
			if (rn2(2)) { /* change aquamarine from green to blue? */
			    COPY_OBJ_DESCR(objects[AQUAMARINE],objects[SAPPHIRE]);
			}
			switch (rn2(4)) { /* change fluorite from violet? */
			    case 0:  break;
			    case 1:	/* blue */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[SAPPHIRE]);
				break;
			    case 2:	/* white */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[DIAMOND]);
				break;
			    case 3:	/* green */
				COPY_OBJ_DESCR(objects[FLUORITE],objects[EMERALD]);
				break;
			}
		}
	check:
		sum = 0;
		for (i = first; i < last; i++) sum += objects[i].oc_prob;
		if (sum == 0) {
			for (i = first; i < last; i++)
			    objects[i].oc_prob = (1000+i-first)/(last-first);
			goto check;
		}
		if (sum != 1000)
			raw_printf("init-prob error for class %d (%d%%)\n", oclass, sum);
		
		first = last;
	}
	/* shuffle descriptions */
	shuffle_all();
}